

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::PropertyRecord_const*>
          (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key)

{
  long lVar1;
  hash_t hashCode;
  long lVar2;
  JavascriptString *pJVar3;
  PropertyRecord *pPVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  charcount_t cVar8;
  int iVar9;
  undefined4 *puVar10;
  char16 *pcVar11;
  PropertyRecord *string1;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  DictionaryStats *this_00;
  uint uVar15;
  
  lVar2 = *(long *)this;
  uVar7 = 0;
  if (lVar2 != 0) {
    hashCode = (*key)->hash * 2 + 1;
    uVar7 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar15 = *(uint *)(lVar2 + (ulong)uVar7 * 4);
    uVar7 = 0;
    if (-1 < (int)uVar15) {
      lVar2 = *(long *)(this + 8);
      uVar7 = 0;
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pJVar3 = *(JavascriptString **)(lVar2 + 8 + (ulong)uVar15 * 0x18);
        pcVar11 = Js::JavascriptString::GetString(pJVar3);
        cVar8 = Js::JavascriptString::GetLength(pJVar3);
        if (cVar8 == 0) {
          iVar9 = 0x2393b8b;
        }
        else {
          uVar12 = 0x811c9dc5;
          uVar13 = 0;
          do {
            uVar14 = (ushort)pcVar11[uVar13] ^ uVar12;
            uVar12 = uVar14 * 0x1000193;
            uVar13 = uVar13 + 1;
          } while (cVar8 != uVar13);
          iVar9 = uVar14 * 0x2000326 + 1;
        }
        lVar1 = lVar2 + (ulong)uVar15 * 0x18;
        if (iVar9 != *(int *)(lVar1 + 0x10)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                             ,199,
                             "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                             ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
          if (!bVar6) {
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar10 = 0;
        }
        if (*(hash_t *)(lVar1 + 0x10) == hashCode) {
          pJVar3 = *(JavascriptString **)(lVar1 + 8);
          pPVar4 = *key;
          cVar8 = Js::JavascriptString::GetLength(pJVar3);
          if ((cVar8 == pPVar4->byteCount >> 1) && (0xf < (uint)pPVar4->pid)) {
            string1 = (PropertyRecord *)Js::JavascriptString::GetString(pJVar3);
            cVar8 = Js::JavascriptString::GetLength(pJVar3);
            if (string1 != pPVar4 + 1) {
              iVar9 = PAL_wmemcmp((char16_t *)string1,(char16_t *)(pPVar4 + 1),(ulong)cVar8);
              if (iVar9 != 0) goto LAB_00e40228;
            }
            this_00 = *(DictionaryStats **)(this + 0x30);
            goto LAB_00e40245;
          }
        }
LAB_00e40228:
        uVar7 = uVar7 + 1;
        uVar15 = *(uint *)(lVar1 + 4);
      } while (-1 < (int)uVar15);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar15 = 0xffffffff;
LAB_00e40245:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar7);
  }
  return uVar15;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }